

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

FStateLabels *
FStateDefinitions::CreateStateLabelList(TArray<FStateDefine,_FStateDefine> *statelist)

{
  bool bVar1;
  uint uVar2;
  FStateDefine *pFVar3;
  FStateLabels *pFVar4;
  int local_2c;
  int i_1;
  FStateLabels *list;
  int count;
  int i;
  TArray<FStateDefine,_FStateDefine> *statelist_local;
  
  list._4_4_ = TArray<FStateDefine,_FStateDefine>::Size(statelist);
LAB_006cfbbb:
  list._4_4_ = list._4_4_ - 1;
  if ((int)list._4_4_ < 0) {
    uVar2 = TArray<FStateDefine,_FStateDefine>::Size(statelist);
    if (uVar2 == 0) {
      statelist_local = (TArray<FStateDefine,_FStateDefine> *)0x0;
    }
    else {
      statelist_local =
           (TArray<FStateDefine,_FStateDefine> *)
           M_Malloc_Dbg((long)(int)(uVar2 - 1) * 0x18 + 0x20,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_states.cpp"
                        ,0x1de);
      *(uint *)&statelist_local->Array = uVar2;
      for (local_2c = 0; local_2c < (int)uVar2; local_2c = local_2c + 1) {
        pFVar3 = TArray<FStateDefine,_FStateDefine>::operator[](statelist,(long)local_2c);
        FName::operator=((FName *)((long)statelist_local + (long)local_2c * 0x18 + 8),&pFVar3->Label
                        );
        pFVar3 = TArray<FStateDefine,_FStateDefine>::operator[](statelist,(long)local_2c);
        *(FState **)((long)statelist_local + (long)local_2c * 0x18 + 0x10) = pFVar3->State;
        pFVar3 = TArray<FStateDefine,_FStateDefine>::operator[](statelist,(long)local_2c);
        pFVar4 = CreateStateLabelList(&pFVar3->Children);
        *(FStateLabels **)((long)statelist_local + (long)local_2c * 0x18 + 0x18) = pFVar4;
      }
      qsort(&statelist_local->Most,(long)(int)uVar2,0x18,labelcmp);
    }
    return (FStateLabels *)statelist_local;
  }
  pFVar3 = TArray<FStateDefine,_FStateDefine>::operator[](statelist,(long)(int)list._4_4_);
  bVar1 = FName::operator==(&pFVar3->Label,NAME_None);
  if (!bVar1) goto code_r0x006cfbdc;
  goto LAB_006cfc0e;
code_r0x006cfbdc:
  pFVar3 = TArray<FStateDefine,_FStateDefine>::operator[](statelist,(long)(int)list._4_4_);
  if (pFVar3->State == (FState *)0x0) {
    pFVar3 = TArray<FStateDefine,_FStateDefine>::operator[](statelist,(long)(int)list._4_4_);
    uVar2 = TArray<FStateDefine,_FStateDefine>::Size(&pFVar3->Children);
    if (uVar2 == 0) {
LAB_006cfc0e:
      TArray<FStateDefine,_FStateDefine>::Delete(statelist,list._4_4_);
    }
  }
  goto LAB_006cfbbb;
}

Assistant:

FStateLabels *FStateDefinitions::CreateStateLabelList(TArray<FStateDefine> & statelist)
{
	// First delete all empty labels from the list
	for (int i = statelist.Size() - 1; i >= 0; i--)
	{
		if (statelist[i].Label == NAME_None || (statelist[i].State == NULL && statelist[i].Children.Size() == 0))
		{
			statelist.Delete(i);
		}
	}

	int count = statelist.Size();

	if (count == 0)
	{
		return NULL;
	}
	FStateLabels *list = (FStateLabels*)M_Malloc(sizeof(FStateLabels)+(count-1)*sizeof(FStateLabel));
	list->NumLabels = count;

	for (int i=0;i<count;i++)
	{
		list->Labels[i].Label = statelist[i].Label;
		list->Labels[i].State = statelist[i].State;
		list->Labels[i].Children = CreateStateLabelList(statelist[i].Children);
	}
	qsort(list->Labels, count, sizeof(FStateLabel), labelcmp);
	return list;
}